

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_seti(lua_State *L,int idx,lua_Integer n)

{
  Table *t;
  long lVar1;
  TValue *t_00;
  TValue *slot;
  TValue *io;
  TValue *io1;
  TValue aux;
  Value local_28;
  undefined1 local_20;
  
  t_00 = index2value(L,idx);
  if (t_00->tt_ == 'E') {
    t = (Table *)(t_00->value_).gc;
    if (n - 1U < (ulong)t->alimit) {
      slot = t->array + (n - 1U);
    }
    else {
      slot = luaH_getint(t,n);
    }
    if ((slot->tt_ & 0xf) != 0) {
      lVar1 = (L->top).offset;
      slot->value_ = *(Value *)(lVar1 + -0x10);
      slot->tt_ = *(lu_byte *)(lVar1 + -8);
      if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) &&
          ((((t_00->value_).gc)->marked & 0x20) != 0)) &&
         ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
        luaC_barrierback_(L,(t_00->value_).gc);
      }
      goto LAB_00105caa;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  local_20 = 3;
  local_28.i = n;
  luaV_finishset(L,t_00,(TValue *)&local_28,(TValue *)((L->top).offset + -0x10),slot);
LAB_00105caa:
  (L->top).p = (StkId)((L->top).offset + -0x10);
  return;
}

Assistant:

LUA_API void lua_seti (lua_State *L, int idx, lua_Integer n) {
  TValue *t;
  const TValue *slot;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2value(L, idx);
  if (luaV_fastgeti(L, t, n, slot)) {
    luaV_finishfastset(L, t, slot, s2v(L->top.p - 1));
  }
  else {
    TValue aux;
    setivalue(&aux, n);
    luaV_finishset(L, t, &aux, s2v(L->top.p - 1), slot);
  }
  L->top.p--;  /* pop value */
  lua_unlock(L);
}